

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O2

DataModelConstructor __thiscall Rml::Context::GetDataModel(Context *this,String *name)

{
  DataModel *model;
  DataModelConstructor local_18;
  
  model = GetDataModelPtr(this,name);
  if (model == (DataModel *)0x0) {
    Log::Message(LT_ERROR,"Data model name \'%s\' could not be found.",(name->_M_dataplus)._M_p);
    DataModelConstructor::DataModelConstructor(&local_18);
  }
  else {
    DataModelConstructor::DataModelConstructor(&local_18,model);
  }
  return local_18;
}

Assistant:

DataModelConstructor Context::GetDataModel(const String& name)
{
	if (DataModel* model = GetDataModelPtr(name))
		return DataModelConstructor(model);

	Log::Message(Log::LT_ERROR, "Data model name '%s' could not be found.", name.c_str());
	return DataModelConstructor();
}